

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O2

void free_temp_abbrevs(Dwarf_D_Abbrev_s *firstab)

{
  Dwarf_D_Abbrev_s *pDVar1;
  
  while (firstab != (Dwarf_D_Abbrev_s *)0x0) {
    pDVar1 = firstab->da_next;
    free(firstab);
    firstab = pDVar1;
  }
  return;
}

Assistant:

static void
free_temp_abbrevs( struct Dwarf_D_Abbrev_s * firstab)
{
    struct Dwarf_D_Abbrev_s *curab = firstab;

    while (curab) {
        struct Dwarf_D_Abbrev_s *nxtab = 0;

        nxtab = curab->da_next;
        curab->da_next = 0;
        free(curab);
        curab = nxtab;
    }
}